

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Float __thiscall pbrt::SobolSampler::sampleDimension(SobolSampler *this,int dimension)

{
  RandomizeStrategy RVar1;
  bool bVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  int vb;
  int va;
  
  if (dimension < 2) {
    uVar3 = this->sequenceIndex;
LAB_003b2194:
    if (uVar3 == 0) {
      auVar7 = ZEXT816(0) << 0x40;
      goto LAB_003b2396;
    }
    uVar5 = 0;
    puVar4 = (uint *)(SobolMatrices32 + (long)(dimension * 0x34) * 4);
    do {
      if ((uVar3 & 1) != 0) {
        uVar5 = uVar5 ^ *puVar4;
      }
      puVar4 = puVar4 + 1;
      bVar2 = 1 < uVar3;
      uVar3 = (long)uVar3 >> 1;
    } while (bVar2);
  }
  else {
    RVar1 = this->randomizeStrategy;
    if (RVar1 == Xor) {
      if (0x3ff < (uint)dimension) goto LAB_003b23eb;
      lVar6 = ((ulong)(uint)dimension * 0x7fb5d329728ea185 >> 0x1b ^
              (ulong)(uint)dimension * 0x7fb5d329728ea185) * -0x7e25210b43d22bb3;
      if (this->sequenceIndex == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        puVar4 = (uint *)(SobolMatrices32 + (ulong)(uint)(dimension * 0x34) * 4);
        uVar3 = this->sequenceIndex;
        do {
          if ((uVar3 & 1) != 0) {
            uVar5 = uVar5 ^ *puVar4;
          }
          puVar4 = puVar4 + 1;
          bVar2 = 1 < uVar3;
          uVar3 = (long)uVar3 >> 1;
        } while (bVar2);
      }
      uVar5 = uVar5 ^ (uint)((ulong)lVar6 >> 0x21) ^ (uint)lVar6;
    }
    else {
      if (RVar1 != CranleyPatterson) {
        if (RVar1 != None) {
          uVar3 = this->sequenceIndex;
          if ((uint)dimension < 0x400) {
            if (uVar3 != 0) {
              do {
                bVar2 = 1 < uVar3;
                uVar3 = (long)uVar3 >> 1;
              } while (bVar2);
            }
            halt_baddata();
          }
LAB_003b23eb:
          _vb = CONCAT44(dimension,0x400);
          LogFatal<char_const(&)[10],char_const(&)[17],char_const(&)[10],int&,char_const(&)[17],int&>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/lowdiscrepancy.h"
                     ,0xb6,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [10])"dimension",
                     (char (*) [17])"NSobolDimensions",(char (*) [10])"dimension",&va,
                     (char (*) [17])"NSobolDimensions",&vb);
        }
        uVar3 = this->sequenceIndex;
        if (0x3ff < (uint)dimension) goto LAB_003b23eb;
        goto LAB_003b2194;
      }
      if (0x3ff < (uint)dimension) goto LAB_003b23eb;
      lVar6 = ((ulong)(uint)dimension * 0x7fb5d329728ea185 >> 0x1b ^
              (ulong)(uint)dimension * 0x7fb5d329728ea185) * -0x7e25210b43d22bb3;
      if (this->sequenceIndex == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        puVar4 = (uint *)(SobolMatrices32 + (ulong)(uint)(dimension * 0x34) * 4);
        uVar3 = this->sequenceIndex;
        do {
          if ((uVar3 & 1) != 0) {
            uVar5 = uVar5 ^ *puVar4;
          }
          puVar4 = puVar4 + 1;
          bVar2 = 1 < uVar3;
          uVar3 = (long)uVar3 >> 1;
        } while (bVar2);
      }
      uVar5 = uVar5 + ((uint)((ulong)lVar6 >> 0x21) ^ (uint)lVar6);
    }
  }
  auVar7 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,uVar5);
  auVar7 = ZEXT416((uint)(auVar7._0_4_ * 2.3283064e-10));
LAB_003b2396:
  auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar7);
  return auVar7._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float sampleDimension(int dimension) const {
        if (dimension < 2 || randomizeStrategy == RandomizeStrategy::None)
            return SobolSample(sequenceIndex, dimension, NoRandomizer());

        if (randomizeStrategy == RandomizeStrategy::CranleyPatterson) {
            uint32_t hash = MixBits(dimension);
            return SobolSample(sequenceIndex, dimension, CranleyPattersonRotator(hash));
        } else if (randomizeStrategy == RandomizeStrategy::Xor) {
            // Only use the dimension! (Want the same scrambling over all
            // pixels).
            uint32_t hash = MixBits(dimension);
            return SobolSample(sequenceIndex, dimension, XORScrambler(hash));
        } else {
            DCHECK(randomizeStrategy == RandomizeStrategy::Owen);
            uint32_t seed = MixBits(dimension);  // Only dimension!
            return SobolSample(sequenceIndex, dimension, OwenScrambler(seed));
        }
    }